

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTInflateMap.cpp
# Opt level: O1

void __thiscall
TTD::InflateMap::LookupInfoForDebugScope
          (InflateMap *this,TTD_PTR_ID dbgScopeId,FunctionBody **homeBody,int32 *chainIndex)

{
  Entry *pEVar1;
  Entry *pEVar2;
  
  pEVar1 = TTDIdentifierDictionary<unsigned_long,_Js::FunctionBody_*>::FindSlotForId<false>
                     (&this->m_debuggerScopeHomeBodyMap,dbgScopeId);
  *homeBody = pEVar1->Data;
  pEVar2 = TTDIdentifierDictionary<unsigned_long,_int>::FindSlotForId<false>
                     (&this->m_debuggerScopeChainIndexMap,dbgScopeId);
  *chainIndex = pEVar2->Data;
  return;
}

Assistant:

void InflateMap::LookupInfoForDebugScope(TTD_PTR_ID dbgScopeId, Js::FunctionBody** homeBody, int32* chainIndex) const
    {
        *homeBody = this->m_debuggerScopeHomeBodyMap.LookupKnownItem(dbgScopeId);
        *chainIndex = this->m_debuggerScopeChainIndexMap.LookupKnownItem(dbgScopeId);
    }